

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.h
# Opt level: O2

void __thiscall
booster::copy_ptr<cppcms::xss::rules::data>::~copy_ptr(copy_ptr<cppcms::xss::rules::data> *this)

{
  data *this_00;
  
  this_00 = this->ptr_;
  if (this_00 != (data *)0x0) {
    cppcms::xss::rules::data::~data(this_00);
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

~copy_ptr() {
			if(ptr_) delete ptr_;
		}